

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypt.c
# Opt level: O1

int ulp_decrypt(ulp_ciphertext *ciphertext,ulp_private_key *priv_key,uint8_t **msg_p)

{
  uint64_t uVar1;
  int iVar2;
  uint64_t *in;
  uint8_t *out;
  ulong uVar3;
  uint64_t uVar4;
  size_t l;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  
  iVar2 = -1;
  if (((priv_key != (ulp_private_key *)0x0 && ciphertext != (ulp_ciphertext *)0x0) &&
      (iVar2 = -2, ciphertext->n == priv_key->n)) && (uVar7 = priv_key->l, ciphertext->l == uVar7))
  {
    in = (uint64_t *)malloc(uVar7 << 3);
    out = (uint8_t *)malloc(((uVar7 >> 3) + 1) - (ulong)((uVar7 & 7) == 0));
    if ((in == (uint64_t *)0x0) || (out == (uint8_t *)0x0)) {
      free(in);
      free(out);
      iVar2 = -1;
    }
    else {
      l = priv_key->l;
      if (l != 0) {
        lVar6 = 0;
        uVar7 = 0;
        do {
          in[uVar7] = ciphertext->c2[uVar7];
          uVar3 = priv_key->n;
          if (uVar3 != 0) {
            uVar5 = 0;
            do {
              uVar1 = in[uVar7];
              uVar4 = mulmod(*(uint64_t *)((long)priv_key->S + uVar5 * 8 + uVar3 * lVar6),
                             ciphertext->c1[uVar5],priv_key->q);
              in[uVar7] = (uVar4 + uVar1) % priv_key->q;
              uVar5 = uVar5 + 1;
              uVar3 = priv_key->n;
            } while (uVar5 < uVar3);
          }
          uVar7 = uVar7 + 1;
          l = priv_key->l;
          lVar6 = lVar6 + 8;
        } while (uVar7 < l);
      }
      decode(in,out,l,priv_key->q);
      free(in);
      *msg_p = out;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int ulp_decrypt(ulp_ciphertext* ciphertext, ulp_private_key* priv_key, uint8_t** msg_p) {

    if(ciphertext == NULL || priv_key == NULL)
        return -1;

    if(ciphertext->n != priv_key->n || ciphertext->l != priv_key->l)
        return -2;

    // compute number of bytes needed for storing the decrypted plaintext
    size_t num_bytes = priv_key->l / 8;
    if(num_bytes * 8 != priv_key->l)
        num_bytes++;

    // allocate memory
    uint64_t* tmp = malloc(priv_key->l * sizeof(priv_key->q));
    uint8_t* msg = malloc(num_bytes);
    if(tmp == NULL || msg == NULL) {
        free(tmp);
        free(msg);
        return -1;
    }

    // S * c1 + c2
    for(size_t i = 0; i < priv_key->l; i++) {
        tmp[i] = ciphertext->c2[i];
        for(size_t j = 0; j < priv_key->n; j++) {
            tmp[i] = (tmp[i] + mulmod(priv_key->S[i*priv_key->n + j], ciphertext->c1[j], priv_key->q)) % priv_key->q;
        }
    }

    // decode decrypted message
    decode(tmp, msg, priv_key->l, priv_key->q);

    // exit properly
    free(tmp);
    *msg_p = msg;
    return 0;

}